

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.c
# Opt level: O2

MovePack * movePack_dup(MovePack *movePack)

{
  MovePack *pMVar1;
  Move **ppMVar2;
  Move *pMVar3;
  ulong uVar4;
  unsigned_long uVar5;
  
  pMVar1 = movePack_create();
  uVar5 = movePack->movesCount;
  ppMVar2 = (Move **)malloc(uVar5 * 8);
  pMVar1->moves = ppMVar2;
  pMVar1->movesCount = uVar5;
  for (uVar4 = 0; uVar4 < uVar5; uVar4 = uVar4 + 1) {
    pMVar3 = move_dup(movePack->moves[uVar4]);
    ppMVar2[uVar4] = pMVar3;
    uVar5 = movePack->movesCount;
  }
  return pMVar1;
}

Assistant:

MovePack * movePack_dup(MovePack * movePack)
{
	unsigned long i;
	MovePack * dupMovePack = movePack_create();
	dupMovePack->moves = (Move **)malloc(sizeof(Move *)*movePack->movesCount);
	dupMovePack->movesCount = movePack->movesCount;
	for(i=0;i<movePack->movesCount;i++)
	{
		dupMovePack->moves[i] = move_dup(movePack->moves[i]);
	}

	return dupMovePack;
}